

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

MDD lddmc_refs_push(MDD lddmc)

{
  MDD *pMVar1;
  long *in_FS_OFFSET;
  MDD lddmc_local;
  
  if (*(long *)(*in_FS_OFFSET + -0x20) == 0) {
    lddmc_refs_init_key();
    lddmc_local = lddmc_refs_push(lddmc);
  }
  else {
    pMVar1 = *(MDD **)(*(long *)(*in_FS_OFFSET + -0x20) + 0x28);
    *(MDD **)(*(long *)(*in_FS_OFFSET + -0x20) + 0x28) = pMVar1 + 1;
    *pMVar1 = lddmc;
    lddmc_local = lddmc;
    if (*(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x28) ==
        *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x20)) {
      lddmc_local = lddmc_refs_refs_up(*(lddmc_refs_internal_t *)(*in_FS_OFFSET + -0x20),lddmc);
    }
  }
  return lddmc_local;
}

Assistant:

MDD __attribute__((unused))
lddmc_refs_push(MDD lddmc)
{
    LOCALIZE_THREAD_LOCAL(lddmc_refs_key, lddmc_refs_internal_t);
    if (lddmc_refs_key == 0) {
        lddmc_refs_init_key();
        return lddmc_refs_push(lddmc);
    } else {
        *(lddmc_refs_key->rcur++) = lddmc;
        if (lddmc_refs_key->rcur == lddmc_refs_key->rend) return lddmc_refs_refs_up(lddmc_refs_key, lddmc);
        else return lddmc;
    }
}